

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcMux.c
# Opt level: O0

Lpk_Fun_t * Lpk_MuxSplit(Lpk_Man_t *pMan,Lpk_Fun_t *p,int Var,int Pol)

{
  uint uVar1;
  uint uVar2;
  int iVar;
  uint *pIn;
  uint *pOut;
  uint *pOut_00;
  Lpk_Fun_t *p_00;
  uint *local_60;
  uint *local_58;
  int iVarVac;
  uint *pTruth1;
  uint *pTruth0;
  uint *pTruth;
  Lpk_Fun_t *pNew;
  int Pol_local;
  int Var_local;
  Lpk_Fun_t *p_local;
  Lpk_Man_t *pMan_local;
  
  pIn = Lpk_FunTruth(p,0);
  pOut = Lpk_FunTruth(p,1);
  pOut_00 = Lpk_FunTruth(p,2);
  if ((Var < 0) || ((int)(*(uint *)&p->field_0x8 >> 7 & 0x1f) <= Var)) {
    __assert_fail("Var >= 0 && Var < (int)p->nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcMux.c"
                  ,0xac,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  if ((*(uint *)&p->field_0x8 >> 0x10 & 0x1f) < 2) {
    __assert_fail("p->nAreaLim >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcMux.c"
                  ,0xad,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  uVar2 = p->uSupp;
  uVar1 = Kit_BitMask(*(uint *)&p->field_0x8 >> 7 & 0x1f);
  if (uVar2 != uVar1) {
    __assert_fail("p->uSupp == Kit_BitMask(p->nVars)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcMux.c"
                  ,0xae,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  Kit_TruthCofactor0New(pOut,pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f,Var);
  Kit_TruthCofactor1New(pOut_00,pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f,Var);
  local_58 = pOut_00;
  if (Pol != 0) {
    local_58 = pOut;
  }
  p_00 = Lpk_FunDup(p,local_58);
  local_60 = pOut;
  if (Pol != 0) {
    local_60 = pOut_00;
  }
  uVar2 = Kit_TruthSupport(local_60,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  p->uSupp = uVar2;
  p->uSupp = 1 << ((byte)Var & 0x1f) | p->uSupp;
  iVar = Kit_WordFindFirstBit(p->uSupp ^ 0xffffffff);
  if ((int)(*(uint *)&p->field_0x8 >> 7 & 0x1f) <= iVar) {
    __assert_fail("iVarVac < (int)p->nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcMux.c"
                  ,0xc0,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  p->uSupp = 1 << ((byte)iVar & 0x1f) | p->uSupp;
  Kit_TruthIthVar(pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f,iVar);
  if (Pol == 0) {
    Kit_TruthMuxVar(pIn,pOut,pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f,Var);
  }
  else {
    Kit_TruthMuxVar(pIn,pIn,pOut_00,*(uint *)&p->field_0x8 >> 7 & 0x1f,Var);
  }
  uVar2 = p->uSupp;
  uVar1 = Kit_TruthSupport(pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  if (uVar2 != uVar1) {
    __assert_fail("p->uSupp == Kit_TruthSupport(pTruth, p->nVars)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcMux.c"
                  ,199,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  p->pFanins[iVar] = (byte)*(undefined4 *)&p_00->field_0x8 & 0x7f;
  p->pDelays[iVar] = (char)(*(uint *)&p->field_0x8 >> 0x15) + -1;
  *(uint *)&p->field_0x8 = *(uint *)&p->field_0x8 & 0xbfffffff;
  Lpk_FunSuppMinimize(p);
  Lpk_FunSuppMinimize(p_00);
  *(uint *)&p_00->field_0x8 =
       *(uint *)&p_00->field_0x8 & 0xc01fffff |
       ((*(uint *)&p->field_0x8 >> 0x15 & 0x1ff) - 1 & 0x1ff) << 0x15;
  if ((*(uint *)&p_00->field_0x8 >> 0xc & 0xf) < (*(uint *)&p_00->field_0x8 >> 7 & 0x1f)) {
    if ((*(uint *)&p->field_0x8 >> 0xc & 0xf) < (*(uint *)&p->field_0x8 >> 7 & 0x1f)) {
      if ((*(uint *)&p->field_0x8 >> 7 & 0x1f) < (*(uint *)&p_00->field_0x8 >> 7 & 0x1f)) {
        *(uint *)&p_00->field_0x8 =
             *(uint *)&p_00->field_0x8 & 0xffe0ffff |
             ((*(uint *)&p->field_0x8 >> 0x10 & 0x1f) / 2 +
             (*(uint *)&p->field_0x8 >> 0x10 & 0x1f) % 2) * 0x10000;
        *(uint *)&p->field_0x8 =
             *(uint *)&p->field_0x8 & 0xffe0ffff |
             ((*(uint *)&p->field_0x8 >> 0x10 & 0x1f) / 2 -
              (*(uint *)&p->field_0x8 >> 0x10 & 0x1f) % 2 & 0x1f) << 0x10;
      }
      else {
        *(uint *)&p_00->field_0x8 =
             *(uint *)&p_00->field_0x8 & 0xffe0ffff |
             ((*(uint *)&p->field_0x8 >> 0x10 & 0x1f) / 2 -
              (*(uint *)&p->field_0x8 >> 0x10 & 0x1f) % 2 & 0x1f) << 0x10;
        *(uint *)&p->field_0x8 =
             *(uint *)&p->field_0x8 & 0xffe0ffff |
             ((*(uint *)&p->field_0x8 >> 0x10 & 0x1f) / 2 +
             (*(uint *)&p->field_0x8 >> 0x10 & 0x1f) % 2) * 0x10000;
      }
    }
    else {
      *(uint *)&p_00->field_0x8 =
           *(uint *)&p_00->field_0x8 & 0xffe0ffff |
           ((*(uint *)&p->field_0x8 >> 0x10 & 0x1f) - 1 & 0x1f) << 0x10;
      *(uint *)&p->field_0x8 = *(uint *)&p->field_0x8 & 0xffe0ffff | 0x10000;
    }
  }
  else {
    *(uint *)&p_00->field_0x8 = *(uint *)&p_00->field_0x8 & 0xffe0ffff | 0x10000;
    *(uint *)&p->field_0x8 =
         *(uint *)&p->field_0x8 & 0xffe0ffff |
         ((*(uint *)&p->field_0x8 >> 0x10 & 0x1f) - 1 & 0x1f) << 0x10;
  }
  *(uint *)&p_00->field_0x8 = *(uint *)&p_00->field_0x8 & 0x7fffffff | 0x80000000;
  return p_00;
}

Assistant:

Lpk_Fun_t * Lpk_MuxSplit( Lpk_Man_t * pMan, Lpk_Fun_t * p, int Var, int Pol )
{
    Lpk_Fun_t * pNew;
    unsigned * pTruth  = Lpk_FunTruth( p, 0 );
    unsigned * pTruth0 = Lpk_FunTruth( p, 1 );
    unsigned * pTruth1 = Lpk_FunTruth( p, 2 );
//    unsigned uSupp;
    int iVarVac; 
    assert( Var >= 0 && Var < (int)p->nVars );
    assert( p->nAreaLim >= 2 );
    assert( p->uSupp == Kit_BitMask(p->nVars) );
    Kit_TruthCofactor0New( pTruth0, pTruth, p->nVars, Var );
    Kit_TruthCofactor1New( pTruth1, pTruth, p->nVars, Var );
/*
uSupp = Kit_TruthSupport( pTruth, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n" );
uSupp = Kit_TruthSupport( pTruth0, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n" );
uSupp = Kit_TruthSupport( pTruth1, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n\n" );
*/
    // derive the new component
    pNew = Lpk_FunDup( p, Pol ? pTruth0 : pTruth1 );
    // update the support of the old component
    p->uSupp  = Kit_TruthSupport( Pol ? pTruth1 : pTruth0, p->nVars );
    p->uSupp |= (1 << Var);
    // update the truth table of the old component
    iVarVac = Kit_WordFindFirstBit( ~p->uSupp );
    assert( iVarVac < (int)p->nVars );
    p->uSupp |= (1 << iVarVac);
    Kit_TruthIthVar( pTruth, p->nVars, iVarVac );
    if ( Pol )
        Kit_TruthMuxVar( pTruth, pTruth, pTruth1, p->nVars, Var );
    else
        Kit_TruthMuxVar( pTruth, pTruth0, pTruth, p->nVars, Var );
    assert( p->uSupp == Kit_TruthSupport(pTruth, p->nVars) );
    // set the decomposed variable
    p->pFanins[iVarVac] = pNew->Id;
    p->pDelays[iVarVac] = p->nDelayLim - 1;
    // support minimize both
    p->fSupports = 0;
    Lpk_FunSuppMinimize( p );
    Lpk_FunSuppMinimize( pNew );
    // update delay and area requirements
    pNew->nDelayLim = p->nDelayLim - 1;
    if ( pNew->nVars <= pNew->nLutK )
    {
        pNew->nAreaLim = 1;
        p->nAreaLim = p->nAreaLim - 1;
    }
    else if ( p->nVars <= p->nLutK )
    {
        pNew->nAreaLim = p->nAreaLim - 1;
        p->nAreaLim = 1;
    }
    else if ( p->nVars < pNew->nVars )
    {
        pNew->nAreaLim = p->nAreaLim / 2 + p->nAreaLim % 2;
        p->nAreaLim = p->nAreaLim / 2 - p->nAreaLim % 2;
    }
    else // if ( pNew->nVars < p->nVars )
    {
        pNew->nAreaLim = p->nAreaLim / 2 - p->nAreaLim % 2;
        p->nAreaLim = p->nAreaLim / 2 + p->nAreaLim % 2;
    }
    pNew->fMark = 1;
    return pNew;
}